

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

void BrotliCompressFragmentFastImpl11
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,int *table,
               uint8_t *cmd_depth,uint16_t *cmd_bits,size_t *cmd_code_numbits,uint8_t *cmd_code,
               size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong *puVar7;
  uint8_t *end;
  long *plVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  bool bVar16;
  size_t local_1b20;
  size_t local_1b18;
  ulong local_1b08;
  size_t local_1b00;
  uint8_t *cmd_depth_local;
  int *table_local;
  int is_last_local;
  size_t input_size_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  size_t insert_1;
  uint32_t cur_hash_1;
  uint32_t prev_hash_1;
  uint64_t input_bytes_1;
  size_t matched_2;
  uint8_t *base_1;
  uint32_t cur_hash;
  uint32_t prev_hash;
  uint64_t input_bytes;
  size_t insert;
  int distance;
  size_t matched;
  uint8_t *base;
  uint32_t bytes_between_hash_lookups;
  uint32_t hash;
  uint8_t *candidate;
  uint8_t *next_ip;
  uint32_t skip;
  uint32_t next_hash;
  uint8_t *ip_limit;
  size_t len_limit;
  size_t i;
  size_t shift;
  long *plStack_1a28;
  int last_distance;
  uint8_t *ip;
  size_t literal_ratio;
  uint16_t lit_bits [256];
  uint8_t lit_depth [256];
  size_t local_1710;
  size_t mlen_storage_ix;
  size_t total_block_size;
  size_t block_size;
  uint8_t *metablock_start;
  size_t kMinMatchLen;
  size_t kInputMarginBytes;
  uint8_t *base_ip;
  uint8_t *next_emit;
  uint8_t *ip_end;
  uint32_t cmd_histo [128];
  ulong local_1480;
  uint8_t *local_1478;
  uint64_t v_52;
  uint8_t *p_52;
  uint64_t v_15;
  uint8_t *p_15;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  uint64_t h_10;
  uint64_t h_1;
  uint64_t h;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_3;
  ulong *local_1248;
  size_t local_1238;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched_1;
  ulong *local_1208;
  size_t local_11f8;
  size_t code_1;
  uint32_t nbits_1;
  size_t tail_1;
  size_t inscode;
  size_t prefix;
  uint32_t nbits;
  size_t tail;
  size_t code;
  uint64_t v_9;
  uint8_t *p_9;
  uint64_t v_8;
  uint8_t *p_8;
  uint64_t v_7;
  uint8_t *p_7;
  uint64_t v_6;
  uint8_t *p_6;
  uint64_t v_5;
  uint8_t *p_5;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  size_t code_8;
  uint32_t nbits_9;
  size_t tail_8;
  size_t inscode_1;
  size_t prefix_5;
  uint32_t nbits_8;
  size_t tail_7;
  size_t code_7;
  uint64_t v_45;
  uint8_t *p_45;
  uint64_t v_44;
  uint8_t *p_44;
  uint64_t v_43;
  uint8_t *p_43;
  uint64_t v_42;
  uint8_t *p_42;
  uint64_t v_41;
  uint8_t *p_41;
  uint64_t v_40;
  uint8_t *p_40;
  uint64_t v_39;
  uint8_t *p_39;
  size_t compressed;
  size_t compressed_1;
  uint64_t v_13;
  uint8_t *p_13;
  uint64_t v_12;
  uint8_t *p_12;
  uint64_t v_11;
  uint8_t *p_11;
  uint64_t v_10;
  uint8_t *p_10;
  uint64_t v_50;
  uint8_t *p_50;
  uint64_t v_49;
  uint8_t *p_49;
  uint64_t v_48;
  uint8_t *p_48;
  uint64_t v_47;
  uint8_t *p_47;
  ulong uStack_aa8;
  uint8_t lit;
  size_t j;
  uint64_t v_14;
  uint8_t *p_14;
  ulong uStack_a28;
  uint8_t lit_1;
  size_t j_1;
  uint64_t v_46;
  uint8_t *p_46;
  ulong uStack_9a8;
  uint8_t lit_2;
  size_t j_2;
  uint64_t v_51;
  uint8_t *p_51;
  size_t distcode_1;
  size_t offset_1;
  size_t prefix_4;
  uint32_t nbits_7;
  size_t d_1;
  uint64_t v_38;
  uint8_t *p_38;
  uint64_t v_37;
  uint8_t *p_37;
  size_t distcode;
  size_t offset;
  size_t prefix_1;
  uint32_t nbits_2;
  size_t d;
  uint64_t v_17;
  uint8_t *p_17;
  uint64_t v_16;
  uint8_t *p_16;
  size_t code_4;
  uint32_t nbits_4;
  size_t tail_4;
  size_t code_3;
  size_t tail_3;
  size_t code_2;
  size_t prefix_2;
  uint32_t nbits_3;
  size_t tail_2;
  uint64_t v_29;
  uint8_t *p_29;
  uint64_t v_28;
  uint8_t *p_28;
  uint64_t v_27;
  uint8_t *p_27;
  uint64_t v_26;
  uint8_t *p_26;
  uint64_t v_25;
  uint8_t *p_25;
  uint64_t v_24;
  uint8_t *p_24;
  uint64_t v_23;
  uint8_t *p_23;
  uint64_t v_22;
  uint8_t *p_22;
  uint64_t v_21;
  uint8_t *p_21;
  uint64_t v_20;
  uint8_t *p_20;
  uint64_t v_19;
  uint8_t *p_19;
  uint64_t v_18;
  uint8_t *p_18;
  uint64_t h_9;
  uint64_t h_8;
  uint64_t h_7;
  uint64_t h_6;
  uint64_t h_5;
  uint64_t h_4;
  uint64_t h_3;
  uint64_t h_2;
  size_t code_6;
  uint32_t nbits_6;
  size_t tail_6;
  size_t code_5;
  size_t prefix_3;
  uint32_t nbits_5;
  size_t tail_5;
  uint64_t v_36;
  uint8_t *p_36;
  uint64_t v_35;
  uint8_t *p_35;
  uint64_t v_34;
  uint8_t *p_34;
  uint64_t v_33;
  uint8_t *p_33;
  uint64_t v_32;
  uint8_t *p_32;
  uint64_t v_31;
  uint8_t *p_31;
  uint64_t v_30;
  uint8_t *p_30;
  
  cmd_histo._504_8_ = storage;
  local_1b00 = input_size;
  if (0x17fff < input_size) {
    local_1b00 = 0x18000;
  }
  total_block_size = local_1b00;
  mlen_storage_ix = local_1b00;
  local_1710 = *storage_ix + 3;
  BrotliStoreMetaBlockHeader(local_1b00,0,storage_ix,storage);
  puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
  *puVar7 = 0L << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
  *storage_ix = *storage_ix + 0xd;
  ip = (uint8_t *)
       BuildAndStoreLiteralPrefixCode
                 (m,input,local_1b00,(uint8_t *)(lit_bits + 0xfc),(uint16_t *)&literal_ratio,
                  storage_ix,(uint8_t *)cmd_histo._504_8_);
  for (len_limit = 0; len_limit + 7 < *cmd_code_numbits; len_limit = len_limit + 8) {
    puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
    *puVar7 = (ulong)cmd_code[len_limit >> 3] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
    *storage_ix = *storage_ix + 8;
  }
  uVar11 = *cmd_code_numbits;
  puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
  *puVar7 = (ulong)cmd_code[*cmd_code_numbits >> 3] << ((byte)*storage_ix & 7) |
            (ulong)(byte)*puVar7;
  *storage_ix = (uVar11 & 7) + *storage_ix;
  block_size = (size_t)input;
  base_ip = input;
  local_1480 = input_size;
  local_1478 = input;
  while( true ) {
    memcpy(&ip_end,kCmdHistoSeed,0x200);
    shift._4_4_ = -1;
    end = local_1478 + total_block_size;
    if (0xf < total_block_size) break;
LAB_0015c2ae:
    local_1478 = local_1478 + total_block_size;
    local_1480 = local_1480 - total_block_size;
    local_1b18 = local_1480;
    if (0xffff < local_1480) {
      local_1b18 = 0x10000;
    }
    total_block_size = local_1b18;
    if (((local_1480 == 0) || (0x100000 < mlen_storage_ix + local_1b18)) ||
       (iVar4 = ShouldMergeBlock(local_1478,local_1b18,(uint8_t *)(lit_bits + 0xfc)), iVar4 == 0)) {
      if (base_ip < end) {
        uVar11 = (long)end - (long)base_ip;
        if (uVar11 < 0x1842) {
          if (uVar11 < 6) {
            bVar1 = cmd_depth[uVar11 + 0x28];
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            *puVar7 = (ulong)cmd_bits[uVar11 + 0x28] << ((byte)*storage_ix & 7) |
                      (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
            cmd_histo[uVar11 + 0x26] = cmd_histo[uVar11 + 0x26] + 1;
          }
          else if (uVar11 < 0x82) {
            uVar14 = uVar11 - 2;
            iVar4 = 0x1f;
            if ((uint)uVar14 != 0) {
              for (; (uint)uVar14 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            uVar5 = iVar4 - 1;
            uVar12 = uVar14 >> ((byte)uVar5 & 0x3f);
            lVar13 = uVar5 * 2 + uVar12;
            bVar1 = cmd_depth[lVar13 + 0x2a];
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            *puVar7 = (ulong)cmd_bits[lVar13 + 0x2a] << ((byte)*storage_ix & 7) |
                      (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            *puVar7 = uVar14 - (uVar12 << ((byte)uVar5 & 0x3f)) << ((byte)*storage_ix & 7) |
                      (ulong)(byte)*puVar7;
            *storage_ix = (ulong)uVar5 + *storage_ix;
            cmd_histo[lVar13 + 0x28] = cmd_histo[lVar13 + 0x28] + 1;
          }
          else if (uVar11 < 0x842) {
            uVar5 = 0x1f;
            uVar6 = (uint)(uVar11 - 0x42);
            if (uVar6 != 0) {
              for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar14 = (ulong)(uVar5 + 0x32);
            bVar1 = cmd_depth[uVar14];
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            *puVar7 = (ulong)cmd_bits[uVar14] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            *puVar7 = (uVar11 - 0x42) - (1L << ((byte)uVar5 & 0x3f)) << ((byte)*storage_ix & 7) |
                      (ulong)(byte)*puVar7;
            *storage_ix = (ulong)uVar5 + *storage_ix;
            cmd_histo[uVar14 - 2] = cmd_histo[uVar14 - 2] + 1;
          }
          else {
            bVar1 = cmd_depth[0x3d];
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            *puVar7 = (ulong)cmd_bits[0x3d] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            *puVar7 = uVar11 - 0x842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
            *storage_ix = *storage_ix + 0xc;
            cmd_histo[0x3b] = cmd_histo[0x3b] + 1;
          }
          for (uStack_a28 = 0; uStack_a28 < uVar11; uStack_a28 = uStack_a28 + 1) {
            bVar1 = *(byte *)((long)lit_bits + (ulong)base_ip[uStack_a28] + 0x1f8);
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            *puVar7 = (ulong)lit_bits[(ulong)base_ip[uStack_a28] - 4] << ((byte)*storage_ix & 7) |
                      (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
          }
        }
        else {
          uVar14 = ((long)base_ip - block_size) * 0x32;
          if ((uVar14 < uVar11 || uVar14 - uVar11 == 0) && (uint8_t *)0x3d4 < ip) {
            EmitUncompressedMetaBlock
                      ((uint8_t *)block_size,end,local_1710 - 3,storage_ix,
                       (uint8_t *)cmd_histo._504_8_);
          }
          else {
            if (uVar11 < 0x5842) {
              bVar1 = cmd_depth[0x3e];
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              *puVar7 = (ulong)cmd_bits[0x3e] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
              *storage_ix = (ulong)bVar1 + *storage_ix;
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              *puVar7 = uVar11 - 0x1842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
              *storage_ix = *storage_ix + 0xe;
              cmd_histo[0x3c] = cmd_histo[0x3c] + 1;
            }
            else {
              bVar1 = cmd_depth[0x3f];
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              *puVar7 = (ulong)cmd_bits[0x3f] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
              *storage_ix = (ulong)bVar1 + *storage_ix;
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              *puVar7 = uVar11 - 0x5842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
              *storage_ix = *storage_ix + 0x18;
              cmd_histo[0x3d] = cmd_histo[0x3d] + 1;
            }
            for (uStack_9a8 = 0; uStack_9a8 < uVar11; uStack_9a8 = uStack_9a8 + 1) {
              bVar1 = *(byte *)((long)lit_bits + (ulong)base_ip[uStack_9a8] + 0x1f8);
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              *puVar7 = (ulong)lit_bits[(ulong)base_ip[uStack_9a8] - 4] << ((byte)*storage_ix & 7) |
                        (ulong)(byte)*puVar7;
              *storage_ix = (ulong)bVar1 + *storage_ix;
            }
          }
        }
      }
LAB_0015d3bc:
      if (local_1480 == 0) {
        if (is_last == 0) {
          *cmd_code = '\0';
          *cmd_code_numbits = 0;
          BuildAndStoreCommandPrefixCode
                    ((uint32_t *)&ip_end,cmd_depth,cmd_bits,cmd_code_numbits,cmd_code);
        }
        return;
      }
      block_size = (size_t)local_1478;
      if (local_1480 < 0x18000) {
        local_1b20 = local_1480;
      }
      else {
        local_1b20 = 0x18000;
      }
      total_block_size = local_1b20;
      mlen_storage_ix = local_1b20;
      local_1710 = *storage_ix + 3;
      BrotliStoreMetaBlockHeader(local_1b20,0,storage_ix,(uint8_t *)cmd_histo._504_8_);
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = 0L << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = *storage_ix + 0xd;
      ip = (uint8_t *)
           BuildAndStoreLiteralPrefixCode
                     (m,local_1478,local_1b20,(uint8_t *)(lit_bits + 0xfc),
                      (uint16_t *)&literal_ratio,storage_ix,(uint8_t *)cmd_histo._504_8_);
      BuildAndStoreCommandPrefixCode
                ((uint32_t *)&ip_end,cmd_depth,cmd_bits,storage_ix,(uint8_t *)cmd_histo._504_8_);
      base_ip = local_1478;
    }
    else {
      mlen_storage_ix = local_1b18 + mlen_storage_ix;
      UpdateBits(0x14,(int)mlen_storage_ix - 1,local_1710,(uint8_t *)cmd_histo._504_8_);
    }
  }
  local_1b08 = local_1480 - 0x10;
  if (total_block_size - 5 < local_1b08) {
    local_1b08 = total_block_size - 5;
  }
  plVar8 = (long *)(local_1478 + local_1b08);
  uVar5 = (uint)((ulong)(*(long *)(local_1478 + 1) * 0x1e35a7bd000000) >> 0x20);
  plVar9 = (long *)(local_1478 + 1);
  do {
    plStack_1a28 = plVar9;
    next_ip._4_4_ = uVar5 >> 0x15;
    next_ip._0_4_ = 0x20;
    candidate = (uint8_t *)plStack_1a28;
    plVar9 = (long *)candidate;
LAB_00158ba6:
    do {
      candidate = (uint8_t *)plVar9;
      uVar5 = (uint)next_ip + 1;
      plVar9 = (long *)(candidate + ((uint)next_ip >> 5));
      if (plVar8 < plVar9) goto LAB_0015c2ae;
      uVar6 = (uint)((ulong)(*plVar9 * 0x1e35a7bd000000) >> 0x35);
      _bytes_between_hash_lookups = (int *)(candidate + -(long)shift._4_4_);
      bVar16 = false;
      if (*(int *)candidate == *_bytes_between_hash_lookups) {
        bVar16 = candidate[4] == (uint8_t)_bytes_between_hash_lookups[1];
      }
      iVar4 = (int)candidate;
      iVar3 = (int)input;
      next_ip._0_4_ = uVar5;
      if ((bVar16) && (_bytes_between_hash_lookups < candidate)) {
        table[next_ip._4_4_] = iVar4 - iVar3;
      }
      else {
        _bytes_between_hash_lookups = (int *)(input + table[next_ip._4_4_]);
        table[next_ip._4_4_] = iVar4 - iVar3;
        bVar16 = false;
        if (*(int *)candidate == *_bytes_between_hash_lookups) {
          bVar16 = candidate[4] == (uint8_t)_bytes_between_hash_lookups[1];
        }
        next_ip._4_4_ = uVar6;
        if (!bVar16) goto LAB_00158ba6;
      }
      next_ip._4_4_ = uVar6;
    } while (0x3fff0 < (long)candidate - (long)_bytes_between_hash_lookups);
    local_1208 = (ulong *)(candidate + 5);
    limit2 = 0;
    x = ((ulong)(end + (-5 - (long)candidate)) >> 3) + 1;
LAB_00158ea7:
    x = x - 1;
    if (x != 0) {
      if (*local_1208 == *(ulong *)((long)_bytes_between_hash_lookups + limit2 + 5)) break;
      iVar2 = 0;
      for (uVar11 = *local_1208 ^ *(ulong *)((long)_bytes_between_hash_lookups + limit2 + 5);
          (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
        iVar2 = iVar2 + 1;
      }
      local_11f8 = ((ulong)(long)iVar2 >> 3) + limit2;
      goto LAB_0015904a;
    }
    matched_1 = ((ulong)(end + (-5 - (long)candidate)) & 7) + 1;
    while (matched_1 = matched_1 - 1, matched_1 != 0) {
      if (*(char *)((long)_bytes_between_hash_lookups + limit2 + 5) != (char)*local_1208) {
        local_11f8 = limit2;
        goto LAB_0015904a;
      }
      local_1208 = (ulong *)((long)local_1208 + 1);
      limit2 = limit2 + 1;
    }
    local_11f8 = limit2;
LAB_0015904a:
    uVar11 = local_11f8 + 5;
    iVar4 = iVar4 - (int)_bytes_between_hash_lookups;
    uVar14 = (long)candidate - (long)base_ip;
    plStack_1a28 = (long *)(candidate + uVar11);
    if (uVar14 < 0x1842) {
      if (uVar14 < 6) {
        bVar1 = cmd_depth[uVar14 + 0x28];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[uVar14 + 0x28] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[uVar14 + 0x26] = cmd_histo[uVar14 + 0x26] + 1;
      }
      else if (uVar14 < 0x82) {
        uVar12 = uVar14 - 2;
        iVar2 = 0x1f;
        if ((uint)uVar12 != 0) {
          for (; (uint)uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar5 = iVar2 - 1;
        uVar10 = uVar12 >> ((byte)uVar5 & 0x3f);
        lVar13 = uVar5 * 2 + uVar10;
        bVar1 = cmd_depth[lVar13 + 0x2a];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[lVar13 + 0x2a] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = uVar12 - (uVar10 << ((byte)uVar5 & 0x3f)) << ((byte)*storage_ix & 7) |
                  (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        cmd_histo[lVar13 + 0x28] = cmd_histo[lVar13 + 0x28] + 1;
      }
      else if (uVar14 < 0x842) {
        uVar5 = 0x1f;
        uVar6 = (uint)(uVar14 - 0x42);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar12 = (ulong)(uVar5 + 0x32);
        bVar1 = cmd_depth[uVar12];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[uVar12] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (uVar14 - 0x42) - (1L << ((byte)uVar5 & 0x3f)) << ((byte)*storage_ix & 7) |
                  (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        cmd_histo[uVar12 - 2] = cmd_histo[uVar12 - 2] + 1;
      }
      else {
        bVar1 = cmd_depth[0x3d];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[0x3d] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = uVar14 - 0x842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0xc;
        cmd_histo[0x3b] = cmd_histo[0x3b] + 1;
      }
    }
    else {
      uVar12 = ((long)base_ip - block_size) * 0x32;
      if ((uVar12 < uVar14 || uVar12 - uVar14 == 0) && (uint8_t *)0x3d4 < ip) {
        EmitUncompressedMetaBlock
                  ((uint8_t *)block_size,candidate,local_1710 - 3,storage_ix,
                   (uint8_t *)cmd_histo._504_8_);
        local_1480 = local_1480 - ((long)candidate - (long)local_1478);
        local_1478 = candidate;
        goto LAB_0015d3bc;
      }
      if (uVar14 < 0x5842) {
        bVar1 = cmd_depth[0x3e];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[0x3e] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = uVar14 - 0x1842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0xe;
        cmd_histo[0x3c] = cmd_histo[0x3c] + 1;
      }
      else {
        bVar1 = cmd_depth[0x3f];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[0x3f] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = uVar14 - 0x5842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0x18;
        cmd_histo[0x3d] = cmd_histo[0x3d] + 1;
      }
    }
    for (uStack_aa8 = 0; uStack_aa8 < uVar14; uStack_aa8 = uStack_aa8 + 1) {
      bVar1 = *(byte *)((long)lit_bits + (ulong)base_ip[uStack_aa8] + 0x1f8);
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = (ulong)lit_bits[(ulong)base_ip[uStack_aa8] - 4] << ((byte)*storage_ix & 7) |
                (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
    }
    if (iVar4 == shift._4_4_) {
      bVar1 = cmd_depth[0x40];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = (ulong)cmd_bits[0x40] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      cmd_histo[0x3e] = cmd_histo[0x3e] + 1;
    }
    else {
      uVar14 = (long)iVar4 + 3;
      iVar2 = 0x1f;
      if ((uint)uVar14 != 0) {
        for (; (uint)uVar14 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      bVar15 = (byte)(iVar2 - 1U);
      uVar12 = uVar14 >> (bVar15 & 0x3f) & 1;
      lVar13 = (uint)((iVar2 + -2) * 2) + uVar12;
      bVar1 = cmd_depth[lVar13 + 0x50];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = (ulong)cmd_bits[lVar13 + 0x50] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = uVar14 - (uVar12 + 2 << (bVar15 & 0x3f)) << ((byte)*storage_ix & 7) |
                (ulong)(byte)*puVar7;
      *storage_ix = (ulong)(iVar2 - 1U) + *storage_ix;
      cmd_histo[lVar13 + 0x4e] = cmd_histo[lVar13 + 0x4e] + 1;
      shift._4_4_ = iVar4;
    }
    if (uVar11 < 0xc) {
      bVar1 = cmd_depth[local_11f8 + 1];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = (ulong)cmd_bits[local_11f8 + 1] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      cmd_histo[local_11f8 - 1] = cmd_histo[local_11f8 - 1] + 1;
    }
    else if (uVar11 < 0x48) {
      uVar11 = local_11f8 - 3;
      iVar4 = 0x1f;
      if ((uint)uVar11 != 0) {
        for (; (uint)uVar11 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar5 = iVar4 - 1;
      uVar14 = uVar11 >> ((byte)uVar5 & 0x3f);
      lVar13 = uVar5 * 2 + uVar14;
      bVar1 = cmd_depth[lVar13 + 4];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = (ulong)cmd_bits[lVar13 + 4] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = uVar11 - (uVar14 << ((byte)uVar5 & 0x3f)) << ((byte)*storage_ix & 7) |
                (ulong)(byte)*puVar7;
      *storage_ix = (ulong)uVar5 + *storage_ix;
      cmd_histo[lVar13 + 2] = cmd_histo[lVar13 + 2] + 1;
    }
    else {
      if (uVar11 < 0x88) {
        uVar11 = local_11f8 - 3 >> 5;
        bVar1 = cmd_depth[uVar11 + 0x1e];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[uVar11 + 0x1e] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (local_11f8 - 3 & 0x1f) << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 5;
        bVar1 = cmd_depth[0x40];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[0x40] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[uVar11 + 0x1c] = cmd_histo[uVar11 + 0x1c] + 1;
      }
      else if (uVar11 < 0x848) {
        uVar5 = 0x1f;
        uVar6 = (uint)(local_11f8 - 0x43);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar11 = (ulong)(uVar5 + 0x1c);
        bVar1 = cmd_depth[uVar11];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[uVar11] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (local_11f8 - 0x43) - (1L << ((byte)uVar5 & 0x3f)) << ((byte)*storage_ix & 7) |
                  (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        bVar1 = cmd_depth[0x40];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[0x40] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[uVar11 - 2] = cmd_histo[uVar11 - 2] + 1;
      }
      else {
        bVar1 = cmd_depth[0x27];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[0x27] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = local_11f8 - 0x843 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0x18;
        bVar1 = cmd_depth[0x40];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[0x40] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[0x25] = cmd_histo[0x25] + 1;
      }
      cmd_histo[0x3e] = cmd_histo[0x3e] + 1;
    }
    base_ip = (uint8_t *)plStack_1a28;
    if (plVar8 <= plStack_1a28) goto LAB_0015c2ae;
    uVar11 = *(ulong *)((long)plStack_1a28 + -3);
    uVar14 = (uVar11 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
    iVar2 = (int)plStack_1a28;
    table[uVar11 * 0x1e35a7bd000000 >> 0x35] = (iVar2 - iVar3) + -3;
    table[(uVar11 >> 8) * 0x1e35a7bd000000 >> 0x35] = (iVar2 - iVar3) + -2;
    table[(uVar11 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = (iVar2 - iVar3) + -1;
    iVar4 = table[uVar14];
    table[uVar14] = iVar2 - iVar3;
    while( true ) {
      _bytes_between_hash_lookups = (int *)(input + iVar4);
      bVar16 = false;
      if ((int)*plStack_1a28 == *_bytes_between_hash_lookups) {
        bVar16 = *(char *)((long)plStack_1a28 + 4) == (char)_bytes_between_hash_lookups[1];
      }
      if (!bVar16) break;
      local_1248 = (ulong *)((long)plStack_1a28 + 5);
      limit2_1 = 0;
      x_1 = ((ulong)(end + (-5 - (long)plStack_1a28)) >> 3) + 1;
LAB_0015b342:
      x_1 = x_1 - 1;
      if (x_1 != 0) {
        if (*local_1248 == *(ulong *)((long)_bytes_between_hash_lookups + limit2_1 + 5))
        goto LAB_0015b3a4;
        iVar4 = 0;
        for (uVar11 = *local_1248 ^ *(ulong *)((long)_bytes_between_hash_lookups + limit2_1 + 5);
            (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          iVar4 = iVar4 + 1;
        }
        local_1238 = ((ulong)(long)iVar4 >> 3) + limit2_1;
        goto LAB_0015b4e5;
      }
      matched_3 = ((ulong)(end + (-5 - (long)plStack_1a28)) & 7) + 1;
      while (matched_3 = matched_3 - 1, matched_3 != 0) {
        if (*(char *)((long)_bytes_between_hash_lookups + limit2_1 + 5) != (char)*local_1248) {
          local_1238 = limit2_1;
          goto LAB_0015b4e5;
        }
        local_1248 = (ulong *)((long)local_1248 + 1);
        limit2_1 = limit2_1 + 1;
      }
      local_1238 = limit2_1;
LAB_0015b4e5:
      uVar11 = local_1238 + 5;
      if (0x3fff0 < (long)plStack_1a28 - (long)_bytes_between_hash_lookups) break;
      base_ip = (uint8_t *)(uVar11 + (long)plStack_1a28);
      shift._4_4_ = (int)plStack_1a28 - (int)_bytes_between_hash_lookups;
      if (uVar11 < 10) {
        bVar1 = cmd_depth[local_1238 + 0x13];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[local_1238 + 0x13] << ((byte)*storage_ix & 7) |
                  (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[local_1238 + 0x11] = cmd_histo[local_1238 + 0x11] + 1;
      }
      else if (uVar11 < 0x86) {
        uVar11 = local_1238 - 1;
        iVar4 = 0x1f;
        if ((uint)uVar11 != 0) {
          for (; (uint)uVar11 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar5 = iVar4 - 1;
        uVar14 = uVar11 >> ((byte)uVar5 & 0x3f);
        lVar13 = uVar5 * 2 + uVar14;
        bVar1 = cmd_depth[lVar13 + 0x14];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[lVar13 + 0x14] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = uVar11 - (uVar14 << ((byte)uVar5 & 0x3f)) << ((byte)*storage_ix & 7) |
                  (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        cmd_histo[lVar13 + 0x12] = cmd_histo[lVar13 + 0x12] + 1;
      }
      else if (uVar11 < 0x846) {
        uVar5 = 0x1f;
        uVar6 = (uint)(local_1238 - 0x41);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar11 = (ulong)(uVar5 + 0x1c);
        bVar1 = cmd_depth[uVar11];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[uVar11] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (local_1238 - 0x41) - (1L << ((byte)uVar5 & 0x3f)) << ((byte)*storage_ix & 7) |
                  (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        cmd_histo[uVar11 - 2] = cmd_histo[uVar11 - 2] + 1;
      }
      else {
        bVar1 = cmd_depth[0x27];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (ulong)cmd_bits[0x27] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = local_1238 - 0x841 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0x18;
        cmd_histo[0x25] = cmd_histo[0x25] + 1;
      }
      uVar11 = (long)shift._4_4_ + 3;
      iVar4 = 0x1f;
      if ((uint)uVar11 != 0) {
        for (; (uint)uVar11 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      bVar15 = (byte)(iVar4 - 1U);
      uVar14 = uVar11 >> (bVar15 & 0x3f) & 1;
      lVar13 = (uint)((iVar4 + -2) * 2) + uVar14;
      bVar1 = cmd_depth[lVar13 + 0x50];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = (ulong)cmd_bits[lVar13 + 0x50] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = uVar11 - (uVar14 + 2 << (bVar15 & 0x3f)) << ((byte)*storage_ix & 7) |
                (ulong)(byte)*puVar7;
      *storage_ix = (ulong)(iVar4 - 1U) + *storage_ix;
      cmd_histo[lVar13 + 0x4e] = cmd_histo[lVar13 + 0x4e] + 1;
      if (plVar8 <= base_ip) goto LAB_0015c2ae;
      uVar11 = *(ulong *)((long)base_ip + -3);
      uVar14 = (uVar11 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
      iVar2 = (int)base_ip;
      table[uVar11 * 0x1e35a7bd000000 >> 0x35] = (iVar2 - iVar3) + -3;
      table[(uVar11 >> 8) * 0x1e35a7bd000000 >> 0x35] = (iVar2 - iVar3) + -2;
      table[(uVar11 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = (iVar2 - iVar3) + -1;
      iVar4 = table[uVar14];
      table[uVar14] = iVar2 - iVar3;
      plStack_1a28 = (long *)base_ip;
    }
    uVar5 = (uint)((ulong)(*(long *)((long)plStack_1a28 + 1) * 0x1e35a7bd000000) >> 0x20);
    plVar9 = (long *)((long)plStack_1a28 + 1);
    base_ip = (uint8_t *)plStack_1a28;
  } while( true );
  local_1208 = local_1208 + 1;
  limit2 = limit2 + 8;
  goto LAB_00158ea7;
LAB_0015b3a4:
  local_1248 = local_1248 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0015b342;
}

Assistant:

void BrotliCompressFragmentFast(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size, uint8_t cmd_depth[128],
    uint16_t cmd_bits[128], size_t* cmd_code_numbits, uint8_t* cmd_code,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          m, input, input_size, is_last, table, cmd_depth, cmd_bits, \
          cmd_code_numbits, cmd_code, storage_ix, storage);          \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}